

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RegisterLikeFunctions(sqlite3 *db,int caseSensitive)

{
  compareInfo *pUserData;
  
  pUserData = &likeInfoAlt;
  if (caseSensitive == 0) {
    pUserData = &likeInfoNorm;
  }
  sqlite3CreateFunc(db,"like",2,1,pUserData,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  sqlite3CreateFunc(db,"like",3,1,pUserData,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  sqlite3CreateFunc(db,"glob",2,1,&globInfo,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  setLikeOptFlag(db,"glob",'\f');
  setLikeOptFlag(db,"like",(caseSensitive != 0) * '\b' + '\x04');
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RegisterLikeFunctions(sqlite3 *db, int caseSensitive){
  struct compareInfo *pInfo;
  if( caseSensitive ){
    pInfo = (struct compareInfo*)&likeInfoAlt;
  }else{
    pInfo = (struct compareInfo*)&likeInfoNorm;
  }
  sqlite3CreateFunc(db, "like", 2, SQLITE_UTF8, pInfo, likeFunc, 0, 0, 0, 0, 0);
  sqlite3CreateFunc(db, "like", 3, SQLITE_UTF8, pInfo, likeFunc, 0, 0, 0, 0, 0);
  sqlite3CreateFunc(db, "glob", 2, SQLITE_UTF8, 
      (struct compareInfo*)&globInfo, likeFunc, 0, 0, 0, 0, 0);
  setLikeOptFlag(db, "glob", SQLITE_FUNC_LIKE | SQLITE_FUNC_CASE);
  setLikeOptFlag(db, "like", 
      caseSensitive ? (SQLITE_FUNC_LIKE | SQLITE_FUNC_CASE) : SQLITE_FUNC_LIKE);
}